

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picobench.hpp
# Opt level: O2

void __thiscall picobench::benchmark::benchmark(benchmark *this,char *name,benchmark_proc proc)

{
  this->_name = name;
  this->_proc = proc;
  this->_baseline = false;
  this->_user_data = 0;
  (this->_state_iterations).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_state_iterations).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_state_iterations).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_samples = 0;
  return;
}

Assistant:

benchmark::benchmark(const char* name, benchmark_proc proc)
    : _name(name)
    , _proc(proc)
{}